

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O1

void __thiscall OmegaOP::algoISOTONIC(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  double *pdVar1;
  double *pdVar2;
  double **ppdVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  double dVar18;
  Costs cost;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  double local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double theV;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  void *local_50;
  double *local_48;
  double local_40;
  ulong local_38;
  
  uVar9 = (ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar7 = this->nbStates;
  uVar15 = (ulong)uVar7;
  Costs::Costs(&cost);
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  uVar16 = (int)uVar9 + 1;
  uVar14 = (ulong)uVar16;
  local_68 = uVar9;
  pvVar4 = operator_new__(uVar14 * 4);
  pvVar5 = operator_new__(uVar14 * 4);
  theV = 0.0;
  local_a0 = 2;
  dVar18 = 0.0;
  local_58 = uVar14;
  if (2 < uVar16) {
    local_88 = (ulong)(uVar7 - 1);
    local_60 = local_88 - 1;
    uVar9 = 0;
    uVar7 = 1;
    local_80 = uVar15;
    local_50 = pvVar4;
    do {
      uVar14 = (ulong)uVar7;
      uVar8 = 0;
      do {
        if (local_88 == uVar8) {
          iVar6 = (int)local_88;
          goto LAB_001084ab;
        }
        lVar17 = uVar8 + 1;
        dVar18 = this->Q[uVar8][uVar14];
        uVar8 = uVar8 + 1;
        pdVar1 = this->Q[lVar17] + uVar14;
      } while (*pdVar1 <= dVar18 && dVar18 != *pdVar1);
      iVar6 = (int)uVar8 + -1;
LAB_001084ab:
      *(int *)((long)pvVar4 + uVar14 * 4) = iVar6;
      uVar10 = uVar15 & 0xffffffff;
      uVar8 = local_60;
      do {
        if (uVar8 == 0xffffffffffffffff) {
          uVar7 = 0;
          break;
        }
        dVar18 = this->Q[uVar8 + 1][uVar14];
        uVar13 = uVar8 & 0xffffffff;
        uVar7 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar7;
        uVar8 = uVar8 - 1;
        pdVar1 = this->Q[uVar13] + uVar14;
      } while (*pdVar1 <= dVar18 && dVar18 != *pdVar1);
      *(uint *)((long)pvVar5 + uVar14 * 4) = uVar7;
      if ((int)uVar15 != 0) {
        uVar14 = 0;
        do {
          local_98 = 1;
          if (local_a0 < 2) {
            local_9c = 0;
            dVar18 = INFINITY;
            uVar7 = 0;
          }
          else {
            uVar15 = 0;
            local_9c = 0;
            dVar18 = INFINITY;
            local_78 = uVar14;
            do {
              if (local_98 < local_a0 - 1) {
                pdVar1 = *this->S12P;
                pdVar2 = this->S12P[2];
                local_90 = dVar18;
                theV = Costs::vhat(&cost,this->states + uVar14,&local_98,&local_a0,pdVar1 + local_98
                                   ,pdVar1 + local_a0,pdVar2 + local_98,pdVar2 + local_a0);
                local_94 = Costs::closestStateIndex(&cost,&theV,this->states,(uint)local_80);
                uVar14 = local_78;
                dVar18 = local_90;
              }
              else {
                local_94 = *(uint *)((long)pvVar4 + (ulong)(local_a0 - 1) * 4);
              }
              uVar8 = (ulong)local_98;
              uVar7 = *(uint *)((long)pvVar4 + uVar8 * 4);
              uVar16 = uVar7;
              if (local_94 < uVar7) {
                uVar16 = local_94;
              }
              uVar12 = (uint)uVar14;
              if (uVar12 < uVar16) {
                uVar16 = uVar12;
              }
              uVar11 = *(uint *)((long)pvVar5 + uVar8 * 4);
              if (uVar11 <= local_94) {
                uVar11 = local_94;
              }
              if (uVar12 < uVar11) {
                uVar11 = uVar12;
              }
              uVar12 = local_9c;
              if (uVar16 < uVar11 + 1) {
                uVar10 = (ulong)local_94;
                if (uVar14 < local_94) {
                  uVar10 = uVar14;
                }
                if (uVar7 <= uVar10) {
                  uVar10 = (ulong)uVar7;
                }
                lVar17 = uVar10 * 8;
                do {
                  local_9c = (uint)uVar15;
                  uVar9 = (ulong)((int)uVar9 + 1);
                  local_40 = *(double *)(*(long *)((long)this->Q + lVar17) + uVar8 * 8);
                  ppdVar3 = this->S12P;
                  uVar15 = (ulong)local_a0;
                  local_48 = *ppdVar3 + uVar15;
                  local_90 = dVar18;
                  local_38 = uVar9;
                  dVar18 = Costs::slopeCost(&cost,(double *)((long)this->states + lVar17),
                                            this->states + uVar14,&local_98,&local_a0,
                                            *ppdVar3 + uVar8,local_48,ppdVar3[1] + uVar8,
                                            ppdVar3[1] + uVar15,ppdVar3[2] + uVar8,
                                            ppdVar3[2] + uVar15);
                  dVar18 = dVar18 + local_40 + this->penalty;
                  uVar8 = (ulong)local_98;
                  if (dVar18 < local_90) {
                    uVar12 = local_98;
                  }
                  uVar15 = (ulong)local_9c;
                  if (dVar18 < local_90) {
                    uVar15 = uVar10 & 0xffffffff;
                  }
                  uVar10 = uVar10 + 1;
                  uVar7 = *(uint *)((long)pvVar5 + uVar8 * 4);
                  if (uVar7 <= local_94) {
                    uVar7 = local_94;
                  }
                  if (local_90 <= dVar18) {
                    dVar18 = local_90;
                  }
                  if ((uint)local_78 < uVar7) {
                    uVar7 = (uint)local_78;
                  }
                  lVar17 = lVar17 + 8;
                  uVar14 = local_78;
                } while (uVar10 < uVar7 + 1);
              }
              uVar7 = (uint)uVar15;
              local_98 = local_98 + 1;
              pvVar4 = local_50;
              local_9c = uVar12;
            } while (local_98 < local_a0);
          }
          this->Q[uVar14][local_a0] = dVar18;
          this->lastChpt[uVar14][local_a0] = local_9c;
          this->lastIndState[uVar14][local_a0] = uVar7;
          uVar14 = uVar14 + 1;
          uVar15 = local_80;
        } while (uVar14 != local_80);
      }
      uVar16 = local_a0 + 1;
      uVar7 = local_a0;
      local_a0 = uVar16;
    } while (uVar16 < (uint)local_58);
    dVar18 = (double)uVar9 + (double)uVar9;
  }
  this->pruning =
       dVar18 / ((double)((int)local_68 - 1) *
                (double)(local_68 & 0xffffffff) *
                (double)(uVar15 & 0xffffffff) * (double)(uVar15 & 0xffffffff));
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  return;
}

Assistant:

void OmegaOP::algoISOTONIC(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  //////////////////////////////////////////////////
  /// CHANNEL INFORMATION
  /// u1 / u2 = "min / max" in each column of Q
  unsigned int* u1 = new unsigned int[n + 1];
  unsigned int* u2 = new unsigned int[n + 1];
  unsigned int theStart;
  unsigned int theEnd;
  double theV = 0;
  unsigned int indexTheV = 0;
  unsigned int nbPosition = 0;

  ///
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    /// FILL u1 and u2 vectors in position T-1
    theStart = 0;
    while(theStart < (p - 1) && Q[theStart][T - 1] > Q[theStart + 1][T - 1])
    {theStart = theStart + 1;}
    u1[T-1] = theStart;
    theEnd = p - 1;
    while(theEnd > 0 && Q[theEnd][T - 1] > Q[theEnd - 1][T - 1])
    {theEnd = theEnd - 1;}
    u2[T-1] = theEnd;

    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        ///// FIND the minimum of the cost in start state
        if(t < (T-1))
        {
          theV = cost.vhat(states[v], t, T, S12P[0][t], S12P[0][T], S12P[2][t], S12P[2][T]);
          indexTheV = cost.closestStateIndex(theV, states, p);
        }
        else
        {
          indexTheV = u1[T-1]; // if t = T-1 cost.slopeCost does not depend on u
        }

        /// explore values (in column of states) with add. constaint u <= v
        for(unsigned int u = std::min(std::min(u1[t],indexTheV), v); u < std::min(std::max(u2[t],indexTheV), v) + 1; u++) /////explore column of states
        {
          nbPosition = nbPosition + 1; //we explore +1 position
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }
      }

      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }

  pruning = 2.0*nbPosition/(1.0*p*p*n*(n-1)); //nbPosition seen / nbPosition total

  delete [] u1;
  u1 = NULL;
  delete [] u2;
  u2 = NULL;
}